

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::DumpBrProperty
               (OpCode op,OpLayoutBrProperty *data,FunctionBody *dumpFunction,ByteCodeReader *reader
               )

{
  PropertyId propertyId;
  ScriptContext *this;
  PropertyRecord *pPVar1;
  
  DumpOffset((int)data->RelativeJumpOffset,reader);
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId = FunctionBody::GetReferencedPropertyId(dumpFunction,data->PropertyIdIndex);
  pPVar1 = ScriptContext::GetPropertyName(this,propertyId);
  Output::Print(L"R%d.%s",(ulong)data->Instance,pPVar1 + 1);
  return;
}

Assistant:

void ByteCodeDumper::DumpBrProperty(OpCode op, const unaligned OpLayoutBrProperty * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpOffset(data->RelativeJumpOffset, reader);
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(
            dumpFunction->GetReferencedPropertyId(data->PropertyIdIndex));
        Output::Print(_u("R%d.%s"), data->Instance, pPropertyName->GetBuffer());
    }